

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

int __thiscall
EnvironmentNAVXYTHETALAT::GetGoalHeuristic(EnvironmentNAVXYTHETALAT *this,int stateID)

{
  EnvNAVXYTHETALATHashEntry_t *pEVar1;
  int iVar2;
  int iVar3;
  double extraout_XMM0_Qa;
  
  pEVar1 = (this->StateID2CoordTable).
           super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
           ._M_impl.super__Vector_impl_data._M_start[stateID];
  iVar2 = SBPL2DGridSearch::getlowerboundoncostfromstart_inmm
                    ((this->super_EnvironmentNAVXYTHETALATTICE).grid2Dsearchfromgoal,pEVar1->X,
                     pEVar1->Y);
  (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
    _vptr_DiscreteSpaceInformation[0x4a])
            (this,(ulong)(uint)pEVar1->X,(ulong)(uint)pEVar1->Y,
             (ulong)(uint)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EndX_c,
             (ulong)(uint)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EndY_c);
  iVar3 = (int)(extraout_XMM0_Qa * 1000.0);
  if ((int)(extraout_XMM0_Qa * 1000.0) < iVar2) {
    iVar3 = iVar2;
  }
  return (int)((double)iVar3 /
              (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.nominalvel_mpersecs);
}

Assistant:

int EnvironmentNAVXYTHETALAT::GetGoalHeuristic(int stateID)
{
#if USE_HEUR==0
    return 0;
#endif

#if DEBUG
    if (stateID >= (int)StateID2CoordTable.size()) {
        throw SBPL_Exception("ERROR in EnvNAVXYTHETALAT... function: stateID illegal");
    }
#endif

    EnvNAVXYTHETALATHashEntry_t* HashEntry = StateID2CoordTable[stateID];
    // computes distances from start state that is grid2D, so it is EndX_c EndY_c
    int h2D = grid2Dsearchfromgoal->getlowerboundoncostfromstart_inmm(HashEntry->X, HashEntry->Y);
    int hEuclid = (int)(NAVXYTHETALAT_COSTMULT_MTOMM *
            EuclideanDistance_m(HashEntry->X, HashEntry->Y, EnvNAVXYTHETALATCfg.EndX_c, EnvNAVXYTHETALATCfg.EndY_c));

    // define this function if it is used in the planner (heuristic backward search would use it)
    return (int)(((double)__max(h2D, hEuclid)) / EnvNAVXYTHETALATCfg.nominalvel_mpersecs);
}